

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

floatx80 floatx80_div_mips64el(floatx80 a,floatx80 b,float_status *status)

{
  floatx80 fVar1;
  ushort uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ushort uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint64_t zSig1;
  uint uVar16;
  uint32_t aLow;
  ulong uVar17;
  bool bVar18;
  floatx80 fVar19;
  flag local_3c;
  
  uVar17 = b.low;
  uVar9 = a.low;
  uVar11 = CONCAT71(b.low._1_7_,-1 < (long)uVar9);
  uVar2 = a.high & 0x7fff;
  if (-1 < (long)uVar9 && ((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0)
  {
LAB_0091ebde:
    status->float_exception_flags = status->float_exception_flags | 1;
    if (status->snan_bit_is_one == '\0') {
      fVar1._10_6_ = (int6)(uVar11 >> 0x10);
      fVar1.high = 0xffff;
      fVar1.low = 0xc000000000000000;
      return fVar1;
    }
    __assert_fail("!snan_bit_is_one(status)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat-specialize.inc.c"
                  ,0xc5,"floatx80 floatx80_default_nan_mips64el(float_status *)");
  }
  uVar11 = CONCAT71(b.low._1_7_,-1 < (long)uVar17);
  uVar12 = b.high & 0x7fff;
  if (((undefined1  [16])b & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 && -1 < (long)uVar17
     ) goto LAB_0091ebde;
  uVar16 = (uint)uVar2;
  uVar5 = b._8_4_ ^ a._8_4_;
  uVar11 = (ulong)uVar5;
  if (uVar2 == 0x7fff) {
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
      if (uVar12 != 0x7fff) {
LAB_0091ed80:
        fVar19._12_4_ = 0;
        fVar19._8_4_ = uVar5 | 0x7fff;
        fVar19.low = 0x8000000000000000;
        return fVar19;
      }
      if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0)
      goto LAB_0091ebde;
    }
LAB_0091ec6f:
    fVar19 = propagateFloatx80NaN_mips64el(a,b,status);
    return fVar19;
  }
  if (((undefined1  [16])b & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
    if (uVar17 == 0) {
      if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 || uVar9 != 0) {
        status->float_exception_flags = status->float_exception_flags | 4;
        goto LAB_0091ed80;
      }
      goto LAB_0091ebde;
    }
    uVar11 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    uVar17 = uVar17 << ((byte)(uVar11 ^ 0x3f) & 0x3f);
    uVar13 = 1 - (int)(uVar11 ^ 0x3f);
  }
  else {
    uVar13 = (uint)uVar12;
    if (uVar12 == 0x7fff) {
      if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0)
      goto LAB_0091ec6f;
      goto LAB_0091ed73;
    }
  }
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
    if (uVar9 == 0) {
LAB_0091ed73:
      return (floatx80)(ZEXT416(uVar5 & 0x8000) << 0x40);
    }
    uVar11 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    uVar9 = uVar9 << ((byte)(uVar11 ^ 0x3f) & 0x3f);
    uVar16 = 1 - (int)(uVar11 ^ 0x3f);
  }
  uVar11 = 0;
  if (uVar17 <= uVar9) {
    uVar11 = uVar9 << 0x3f;
  }
  uVar10 = uVar9 >> (uVar17 <= uVar9);
  uVar8 = uVar17 >> 0x20;
  if (uVar10 < uVar17) {
    uVar14 = 0xffffffff00000000;
    if (uVar10 < (uVar17 & 0xffffffff00000000)) {
      uVar14 = uVar10 / uVar8 << 0x20;
    }
    uVar7 = (uVar14 >> 0x20) * (uVar17 & 0xffffffff);
    uVar3 = uVar14 * uVar17;
    uVar6 = uVar11 - uVar3;
    lVar4 = ((uVar10 - ((uVar7 >> 0x20) + (uVar14 >> 0x20) * uVar8)) - (ulong)(uVar11 < uVar3)) -
            (ulong)(uVar3 < uVar7 << 0x20);
    if (lVar4 < 0) {
      uVar3 = (0x100000000 - uVar14) * uVar17 + uVar11;
      uVar7 = uVar6;
      do {
        uVar14 = uVar14 - 0x100000000;
        uVar6 = uVar7 + (uVar17 << 0x20);
        bVar18 = uVar3 < uVar7;
        uVar3 = uVar3 + (uVar17 << 0x20);
        lVar4 = lVar4 + uVar8 + (ulong)bVar18;
        uVar7 = uVar6;
      } while (lVar4 < 0);
    }
    uVar3 = uVar6 >> 0x20 | lVar4 << 0x20;
    uVar6 = 0xffffffff;
    if (uVar3 < (uVar17 & 0xffffffff00000000)) {
      uVar6 = uVar3 / uVar8;
    }
    uVar6 = uVar6 | uVar14;
  }
  else {
    uVar6 = 0xffffffffffffffff;
  }
  uVar3 = uVar17 & 0xffffffff;
  uVar14 = (uVar6 >> 0x20) * uVar3;
  uVar7 = (uVar6 & 0xffffffff) * uVar8;
  lVar4 = 0;
  uVar15 = uVar7 + uVar14;
  if (CARRY8(uVar7,uVar14)) {
    lVar4 = -0x100000000;
  }
  uVar7 = uVar6 * uVar17;
  uVar14 = uVar11 - uVar7;
  lVar4 = (((uVar10 - (uVar11 < uVar7)) - ((uVar15 >> 0x20) + (uVar6 >> 0x20) * uVar8)) + lVar4) -
          (ulong)(uVar7 < uVar15 << 0x20);
  if (lVar4 < 0) {
    uVar11 = uVar11 + (1 - uVar6) * uVar17;
    uVar10 = uVar14;
    do {
      uVar6 = uVar6 - 1;
      uVar14 = uVar10 + uVar17;
      bVar18 = uVar11 < uVar10;
      uVar11 = uVar11 + uVar17;
      lVar4 = lVar4 + (ulong)bVar18;
      uVar10 = uVar14;
    } while (lVar4 < 0);
  }
  zSig1 = 0xffffffffffffffff;
  if (uVar14 < uVar17) {
    uVar11 = 0xffffffff00000000;
    if (uVar14 < (uVar17 & 0xffffffff00000000)) {
      uVar11 = uVar14 / uVar8 << 0x20;
    }
    uVar15 = (uVar11 >> 0x20) * uVar3;
    uVar7 = uVar11 * uVar17;
    uVar10 = -uVar7;
    lVar4 = ((uVar14 - ((uVar15 >> 0x20) + (uVar11 >> 0x20) * uVar8)) - (ulong)(uVar7 != 0)) -
            (ulong)(uVar7 < uVar15 << 0x20);
    if (lVar4 < 0) {
      uVar7 = (0x100000000 - uVar11) * uVar17;
      uVar15 = uVar10;
      do {
        uVar11 = uVar11 - 0x100000000;
        uVar10 = uVar15 + (uVar17 << 0x20);
        bVar18 = uVar7 < uVar15;
        uVar7 = uVar7 + (uVar17 << 0x20);
        lVar4 = lVar4 + uVar8 + (ulong)bVar18;
        uVar15 = uVar10;
      } while (lVar4 < 0);
    }
    uVar10 = uVar10 >> 0x20 | lVar4 << 0x20;
    uVar7 = 0xffffffff;
    if (uVar10 < (uVar17 & 0xffffffff00000000)) {
      uVar7 = uVar10 / uVar8;
    }
    zSig1 = uVar7 | uVar11;
    if (zSig1 * 2 < 9) {
      uVar3 = uVar3 * (zSig1 >> 0x20);
      uVar11 = (uVar7 & 0xffffffff) * uVar8;
      lVar4 = 0;
      uVar10 = uVar11 + uVar3;
      if (CARRY8(uVar11,uVar3)) {
        lVar4 = -0x100000000;
      }
      uVar3 = zSig1 * uVar17;
      uVar11 = -uVar3;
      lVar4 = (((uVar14 - (uVar3 != 0)) - ((uVar10 >> 0x20) + (zSig1 >> 0x20) * uVar8)) + lVar4) -
              (ulong)(uVar3 < uVar10 << 0x20);
      if (lVar4 < 0) {
        uVar8 = (1 - zSig1) * uVar17;
        do {
          zSig1 = zSig1 - 1;
          bVar18 = uVar8 < uVar11;
          uVar11 = uVar11 + uVar17;
          uVar8 = uVar8 + uVar17;
          lVar4 = lVar4 + (ulong)bVar18;
        } while (lVar4 < 0);
        lVar4 = 0;
      }
      zSig1 = zSig1 | (lVar4 != 0 || uVar11 != 0);
    }
  }
  local_3c = (flag)((uVar5 & 0xffff) >> 0xf);
  fVar19 = roundAndPackFloatx80_mips64el
                     (status->floatx80_rounding_precision,local_3c,
                      (uint)(uVar17 <= uVar9) + (uVar16 - uVar13) + 0x3ffe,uVar6,zSig1,status);
  return fVar19;
}

Assistant:

floatx80 floatx80_div(floatx80 a, floatx80 b, float_status *status)
{
    flag aSign, bSign, zSign;
    int32_t aExp, bExp, zExp;
    uint64_t aSig, bSig, zSig0, zSig1;
    uint64_t rem0, rem1, rem2, term0, term1, term2;

    if (floatx80_invalid_encoding(a) || floatx80_invalid_encoding(b)) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    bSig = extractFloatx80Frac( b );
    bExp = extractFloatx80Exp( b );
    bSign = extractFloatx80Sign( b );
    zSign = aSign ^ bSign;
    if ( aExp == 0x7FFF ) {
        if ((uint64_t)(aSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        if ( bExp == 0x7FFF ) {
            if ((uint64_t)(bSig << 1)) {
                return propagateFloatx80NaN(a, b, status);
            }
            goto invalid;
        }
        return packFloatx80(zSign, floatx80_infinity_high,
                                   floatx80_infinity_low);
    }
    if ( bExp == 0x7FFF ) {
        if ((uint64_t)(bSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        return packFloatx80( zSign, 0, 0 );
    }
    if ( bExp == 0 ) {
        if ( bSig == 0 ) {
            if ( ( aExp | aSig ) == 0 ) {
 invalid:
                float_raise(float_flag_invalid, status);
                return floatx80_default_nan(status);
            }
            float_raise(float_flag_divbyzero, status);
            return packFloatx80(zSign, floatx80_infinity_high,
                                       floatx80_infinity_low);
        }
        normalizeFloatx80Subnormal( bSig, &bExp, &bSig );
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloatx80( zSign, 0, 0 );
        normalizeFloatx80Subnormal( aSig, &aExp, &aSig );
    }
    zExp = aExp - bExp + 0x3FFE;
    rem1 = 0;
    if ( bSig <= aSig ) {
        shift128Right( aSig, 0, 1, &aSig, &rem1 );
        ++zExp;
    }
    zSig0 = estimateDiv128To64( aSig, rem1, bSig );
    mul64To128( bSig, zSig0, &term0, &term1 );
    sub128( aSig, rem1, term0, term1, &rem0, &rem1 );
    while ( (int64_t) rem0 < 0 ) {
        --zSig0;
        add128( rem0, rem1, 0, bSig, &rem0, &rem1 );
    }
    zSig1 = estimateDiv128To64( rem1, 0, bSig );
    if ( (uint64_t) ( zSig1<<1 ) <= 8 ) {
        mul64To128( bSig, zSig1, &term1, &term2 );
        sub128( rem1, 0, term1, term2, &rem1, &rem2 );
        while ( (int64_t) rem1 < 0 ) {
            --zSig1;
            add128( rem1, rem2, 0, bSig, &rem1, &rem2 );
        }
        zSig1 |= ( ( rem1 | rem2 ) != 0 );
    }
    return roundAndPackFloatx80(status->floatx80_rounding_precision,
                                zSign, zExp, zSig0, zSig1, status);
}